

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O3

void upb::generator::anon_unknown_5::WriteExtension
               (DefPoolPair *pools,FieldDefPtr ext,Output *output)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  FieldDefPtr field;
  upb_MiniTableField *field64;
  upb_MessageDef *this;
  undefined1 is_extension;
  FieldDefPtr ext_00;
  MessageDefPtr message;
  upb_MiniTableField *in_R8;
  string_view format;
  string_view format_00;
  string_view format_01;
  string_view format_02;
  string_view format_03;
  string_view format_04;
  string local_48;
  
  is_extension = SUB81(&local_48,0);
  format._M_str = "UPB_LINKARR_APPEND(upb_AllExts)\n";
  format._M_len = 0x20;
  Output::operator()<>(output,format);
  (anonymous_namespace)::ExtensionVarName_abi_cxx11_
            (&local_48,(_anonymous_namespace_ *)ext.ptr_,ext_00);
  format_00._M_str = "const upb_MiniTableExtension $0 = {\n  ";
  format_00._M_len = 0x26;
  Output::operator()(output,format_00,&local_48);
  paVar1 = &local_48.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  field.ptr_ = (upb_FieldDef *)DefPoolPair::GetFieldFromPool(&pools->pool64_,ext);
  field64 = DefPoolPair::GetFieldFromPool(&pools->pool32_,ext);
  FieldInitializer_abi_cxx11_(&local_48,(generator *)ext.ptr_,field,field64,in_R8);
  format_01._M_str = "$0,\n";
  format_01._M_len = 4;
  Output::operator()(output,format_01,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  this = upb_FieldDef_ContainingType(ext.ptr_);
  (anonymous_namespace)::MessageVarName_abi_cxx11_(&local_48,(_anonymous_namespace_ *)this,message);
  format_02._M_str = "  &$0,\n";
  format_02._M_len = 7;
  Output::operator()(output,format_02,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  (anonymous_namespace)::GetSub_abi_cxx11_
            (&local_48,(_anonymous_namespace_ *)ext.ptr_,(FieldDefPtr)0x1,(bool)is_extension);
  format_03._M_str = "  $0,\n";
  format_03._M_len = 6;
  Output::operator()(output,format_03,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  format_04._M_str = "\n};\n";
  format_04._M_len = 4;
  Output::operator()<>(output,format_04);
  return;
}

Assistant:

void WriteExtension(const DefPoolPair& pools, upb::FieldDefPtr ext,
                    Output& output) {
  output("UPB_LINKARR_APPEND(upb_AllExts)\n");
  output("const upb_MiniTableExtension $0 = {\n  ", ExtensionVarName(ext));
  output("$0,\n", FieldInitializer(pools, ext));
  output("  &$0,\n", MessageVarName(ext.containing_type()));
  output("  $0,\n", GetSub(ext, true));
  output("\n};\n");
}